

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::python::PyiGenerator::PrintImports(PyiGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Printer *pPVar2;
  ushort *puVar3;
  char cVar4;
  bool bVar5;
  FileDescriptor *pFVar6;
  FileDescriptor *desc;
  char *pcVar7;
  ImportModules *in_RDX;
  char *extraout_RDX;
  ImportModules *extraout_RDX_00;
  ImportModules *extraout_RDX_01;
  ImportModules *extraout_RDX_02;
  ImportModules *extraout_RDX_03;
  long lVar8;
  FieldDescriptor *pFVar9;
  int index;
  long lVar10;
  string_view filename;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view filename_00;
  bool has_importlib;
  ImportModules import_modules;
  string module_name;
  size_type __dnew;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_aliases;
  bool local_a1;
  undefined8 local_a0;
  undefined2 local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  FieldDescriptor *local_60;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_58.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_a1 = false;
  pFVar6 = this->file_;
  if (0 < pFVar6->dependency_count_) {
    index = 0;
    do {
      pFVar6 = FileDescriptor::dependency(pFVar6,index);
      if (this->strip_nonfunctional_codegen_ == true) {
        filename._M_str = extraout_RDX;
        filename._M_len = (size_t)(pFVar6->name_->_M_dataplus)._M_p;
        bVar5 = IsKnownFeatureProto((compiler *)pFVar6->name_->_M_string_length,filename);
        in_RDX = extraout_RDX_00;
        if (!bVar5) goto LAB_001fd10e;
      }
      else {
LAB_001fd10e:
        PrintImportForDescriptor
                  (this,pFVar6,
                   (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_58,&local_a1);
        in_RDX = extraout_RDX_01;
        if (0 < pFVar6->public_dependency_count_) {
          lVar8 = 0;
          do {
            desc = FileDescriptor::dependency(pFVar6,pFVar6->public_dependencies_[lVar8]);
            PrintImportForDescriptor
                      (this,desc,
                       (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_58,&local_a1);
            lVar8 = lVar8 + 1;
            in_RDX = extraout_RDX_02;
          } while (lVar8 < pFVar6->public_dependency_count_);
        }
      }
      index = index + 1;
      pFVar6 = this->file_;
    } while (index < pFVar6->dependency_count_);
  }
  local_98 = 0;
  local_a0 = 0;
  if (0 < pFVar6->message_type_count_) {
    local_a0 = 0x10000;
  }
  if (0 < pFVar6->enum_type_count_) {
    local_a0 = (ulong)CONCAT13(1,(undefined3)local_a0);
  }
  if ((this->opensource_runtime_ == false) && (0 < pFVar6->service_count_)) {
    local_98 = 1;
    local_a0 = CONCAT26(0x101,(undefined6)local_a0);
  }
  pFVar6 = this->file_;
  if (0 < pFVar6->message_type_count_) {
    lVar8 = 0;
    lVar10 = 0;
    do {
      CheckImportModules((python *)(&pFVar6->message_types_->super_SymbolBase + lVar8),
                         (Descriptor *)&local_a0,in_RDX);
      lVar10 = lVar10 + 1;
      pFVar6 = this->file_;
      lVar8 = lVar8 + 0xa0;
      in_RDX = extraout_RDX_03;
    } while (lVar10 < pFVar6->message_type_count_);
  }
  paVar1 = &local_90.field_2;
  if (local_a0._0_1_ != '\0') {
    pPVar2 = this->printer_;
    local_70._M_len = 0x18;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    local_90._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_70);
    local_90.field_2._M_allocated_capacity._0_7_ = (undefined7)local_70._M_len;
    local_90.field_2._M_local_buf[7] = (char)(local_70._M_len >> 0x38);
    builtin_strncpy(local_90._M_dataplus._M_p,"google.protobuf.internal",0x18);
    local_90._M_string_length = local_70._M_len;
    local_90._M_dataplus._M_p[local_70._M_len] = '\0';
    text._M_str = "from $internal_package$ import containers as _containers\n";
    text._M_len = 0x39;
    io::Printer::Print<char[17],std::__cxx11::string>
              (pPVar2,text,(char (*) [17])"internal_package",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT17(local_90.field_2._M_local_buf[7],
                               local_90.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  if (local_a0._3_1_ == '\x01') {
    pPVar2 = this->printer_;
    local_70._M_len = 0x18;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    local_90._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_70);
    local_90.field_2._M_allocated_capacity._0_7_ = (undefined7)local_70._M_len;
    local_90.field_2._M_local_buf[7] = (char)(local_70._M_len >> 0x38);
    builtin_strncpy(local_90._M_dataplus._M_p,"google.protobuf.internal",0x18);
    local_90._M_string_length = local_70._M_len;
    local_90._M_dataplus._M_p[local_70._M_len] = '\0';
    text_00._M_str = "from $internal_package$ import enum_type_wrapper as _enum_type_wrapper\n";
    text_00._M_len = 0x47;
    io::Printer::Print<char[17],std::__cxx11::string>
              (pPVar2,text_00,(char (*) [17])"internal_package",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT17(local_90.field_2._M_local_buf[7],
                               local_90.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  if (local_a0._4_1_ == '\x01') {
    pPVar2 = this->printer_;
    local_70._M_len = 0x18;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    local_90._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_70);
    local_90.field_2._M_allocated_capacity._0_7_ = (undefined7)local_70._M_len;
    local_90.field_2._M_local_buf[7] = (char)(local_70._M_len >> 0x38);
    builtin_strncpy(local_90._M_dataplus._M_p,"google.protobuf.internal",0x18);
    local_90._M_string_length = local_70._M_len;
    local_90._M_dataplus._M_p[local_70._M_len] = '\0';
    text_01._M_str = "from $internal_package$ import python_message as _python_message\n";
    text_01._M_len = 0x41;
    io::Printer::Print<char[17],std::__cxx11::string>
              (pPVar2,text_01,(char (*) [17])"internal_package",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT17(local_90.field_2._M_local_buf[7],
                               local_90.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  if (local_98._1_1_ == '\x01') {
    pPVar2 = this->printer_;
    local_70._M_len = 0x18;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    local_90._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_70);
    local_90.field_2._M_allocated_capacity._0_7_ = (undefined7)local_70._M_len;
    local_90.field_2._M_local_buf[7] = (char)(local_70._M_len >> 0x38);
    builtin_strncpy(local_90._M_dataplus._M_p,"google.protobuf.internal",0x18);
    local_90._M_string_length = local_70._M_len;
    local_90._M_dataplus._M_p[local_70._M_len] = '\0';
    text_02._M_str = "from $internal_package$ import well_known_types as _well_known_types\n";
    text_02._M_len = 0x45;
    io::Printer::Print<char[17],std::__cxx11::string>
              (pPVar2,text_02,(char (*) [17])"internal_package",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT17(local_90.field_2._M_local_buf[7],
                               local_90.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  local_90.field_2._M_allocated_capacity._0_7_ = 0x2e656c676f6f67;
  local_90.field_2._M_local_buf[7] = 'p';
  local_90.field_2._8_7_ = 0x6675626f746f72;
  local_90._M_string_length = 0xf;
  local_90.field_2._M_local_buf[0xf] = '\0';
  pcVar7 = "public_package";
  text_03._M_str = "from $public_package$ import descriptor as _descriptor\n";
  text_03._M_len = 0x37;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  io::Printer::Print<char[15],std::__cxx11::string>
            (this->printer_,text_03,(char (*) [15])"public_package",&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT17(local_90.field_2._M_local_buf[7],
                             local_90.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (local_a0._2_1_ == '\x01') {
    local_90.field_2._M_allocated_capacity._0_7_ = 0x2e656c676f6f67;
    local_90.field_2._M_local_buf[7] = 'p';
    local_90.field_2._8_7_ = 0x6675626f746f72;
    local_90._M_string_length = 0xf;
    local_90.field_2._M_local_buf[0xf] = '\0';
    pcVar7 = "public_package";
    text_04._M_str = "from $public_package$ import message as _message\n";
    text_04._M_len = 0x31;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    io::Printer::Print<char[15],std::__cxx11::string>
              (this->printer_,text_04,(char (*) [15])"public_package",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT17(local_90.field_2._M_local_buf[7],
                               local_90.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  if (this->opensource_runtime_ == true) {
    bVar5 = HasGenericServices(this->file_);
    if (bVar5) {
      local_90.field_2._M_allocated_capacity._0_7_ = 0x2e656c676f6f67;
      local_90.field_2._M_local_buf[7] = 'p';
      local_90.field_2._8_7_ = 0x6675626f746f72;
      local_90._M_string_length = 0xf;
      local_90.field_2._M_local_buf[0xf] = '\0';
      pcVar7 = "public_package";
      text_05._M_str = "from $public_package$ import service as _service\n";
      text_05._M_len = 0x31;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      io::Printer::Print<char[15],std::__cxx11::string>
                (this->printer_,text_05,(char (*) [15])"public_package",&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT17(local_90.field_2._M_local_buf[7],
                                 local_90.field_2._M_allocated_capacity._0_7_) + 1);
      }
    }
  }
  else if (0 < this->file_->service_count_) {
    text_06._M_str =
         "from google3.net.rpc.python import proto_python_api_2_stub as _proto_python_api_2_stub\nfrom google3.net.rpc.python import pywraprpc as _pywraprpc\nfrom google3.net.rpc.python import rpcserver as _rpcserver\n"
    ;
    text_06._M_len = 0xcd;
    io::Printer::Print<>(this->printer_,text_06);
  }
  cVar4 = local_a0._1_1_;
  if ((local_a0._1_1_ != '\0') || (local_a0._5_1_ == '\x01')) {
    text_07._M_str = "from collections.abc import";
    text_07._M_len = 0x1b;
    io::Printer::Print<>(this->printer_,text_07);
    if (cVar4 != '\0') {
      text_08._M_str = " Iterable as _Iterable";
      text_08._M_len = 0x16;
      io::Printer::Print<>(this->printer_,text_08);
      if (local_a0._5_1_ == '\x01') {
        text_09._M_str = ",";
        text_09._M_len = 1;
        io::Printer::Print<>(this->printer_,text_09);
      }
    }
    if (local_a0._5_1_ == '\x01') {
      text_10._M_str = " Mapping as _Mapping";
      text_10._M_len = 0x14;
      io::Printer::Print<>(this->printer_,text_10);
    }
    text_11._M_str = "\n";
    text_11._M_len = 1;
    io::Printer::Print<>(this->printer_,text_11);
  }
  text_12._M_str = "from typing import ";
  text_12._M_len = 0x13;
  io::Printer::Print<>(this->printer_,text_12);
  if ((this->opensource_runtime_ == false) && (0 < this->file_->service_count_)) {
    text_13._M_str = "Any as _Any, ";
    text_13._M_len = 0xd;
    io::Printer::Print<>(this->printer_,text_13);
  }
  if ((char)local_98 == '\x01') {
    text_14._M_str = "Callable as _Callable, ";
    text_14._M_len = 0x17;
    io::Printer::Print<>(this->printer_,text_14);
  }
  text_15._M_str = "ClassVar as _ClassVar";
  text_15._M_len = 0x15;
  io::Printer::Print<>(this->printer_,text_15);
  if (local_a0._6_1_ == '\x01') {
    text_16._M_str = ", Optional as _Optional";
    text_16._M_len = 0x17;
    io::Printer::Print<>(this->printer_,text_16);
  }
  if (local_a0._7_1_ == '\x01') {
    text_17._M_str = ", Union as _Union";
    text_17._M_len = 0x11;
    io::Printer::Print<>(this->printer_,text_17);
  }
  text_18._M_str = "\n";
  text_18._M_len = 1;
  io::Printer::Print<>(this->printer_,text_18);
  pFVar6 = this->file_;
  if (0 < pFVar6->public_dependency_count_) {
    pFVar9 = (FieldDescriptor *)0x0;
    do {
      pFVar6 = FileDescriptor::dependency(pFVar6,pFVar6->public_dependencies_[(long)pFVar9]);
      filename_00._M_str = pcVar7;
      filename_00._M_len = (size_t)(pFVar6->name_->_M_dataplus)._M_p;
      local_60 = pFVar9;
      StrippedModuleName_abi_cxx11_(&local_90,(python *)pFVar6->name_->_M_string_length,filename_00)
      ;
      if (0 < pFVar6->message_type_count_) {
        lVar10 = 0x10;
        lVar8 = 0;
        do {
          puVar3 = *(ushort **)(&pFVar6->message_types_->super_SymbolBase + lVar10);
          local_70._M_len = (size_t)*puVar3;
          local_70._M_str = (char *)(~local_70._M_len + (long)puVar3);
          pcVar7 = "module";
          text_19._M_str = "from $module$ import $message_class$ as $message_class$\n";
          text_19._M_len = 0x38;
          io::Printer::
          Print<char[7],std::__cxx11::string,char[14],std::basic_string_view<char,std::char_traits<char>>>
                    (this->printer_,text_19,(char (*) [7])0x579733,&local_90,(char (*) [14])0x607c22
                     ,&local_70);
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 + 0xa0;
        } while (lVar8 < pFVar6->message_type_count_);
      }
      if (0 < pFVar6->enum_type_count_) {
        lVar10 = 8;
        lVar8 = 0;
        do {
          puVar3 = *(ushort **)(&pFVar6->enum_types_->super_SymbolBase + lVar10);
          local_70._M_len = (size_t)*puVar3;
          local_70._M_str = (char *)(~local_70._M_len + (long)puVar3);
          pcVar7 = "module";
          text_20._M_str = "from $module$ import $enum_class$ as $enum_class$\n";
          text_20._M_len = 0x32;
          io::Printer::
          Print<char[7],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
                    (this->printer_,text_20,(char (*) [7])0x579733,&local_90,(char (*) [11])0x64417f
                     ,&local_70);
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 + 0x58;
        } while (lVar8 < pFVar6->enum_type_count_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT17(local_90.field_2._M_local_buf[7],
                                 local_90.field_2._M_allocated_capacity._0_7_) + 1);
      }
      pFVar9 = (FieldDescriptor *)&local_60->field_0x1;
      pFVar6 = this->file_;
    } while ((long)pFVar9 < (long)pFVar6->public_dependency_count_);
  }
  text_21._M_str = "\n";
  text_21._M_len = 1;
  io::Printer::Print<>(this->printer_,text_21);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_58);
  return;
}

Assistant:

void CheckImportModules(const Descriptor* descriptor,
                        ImportModules* import_modules) {
  if (descriptor->extension_range_count() > 0) {
    import_modules->has_extendable = true;
  }
  if (descriptor->enum_type_count() > 0) {
    import_modules->has_enums = true;
  }
  if (IsWellKnownType(descriptor->full_name())) {
    import_modules->has_well_known_type = true;
  }
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (IsPythonKeyword(field->name())) {
      continue;
    }
    import_modules->has_optional = true;
    if (field->is_repeated()) {
      import_modules->has_repeated = true;
    }
    if (field->is_map()) {
      import_modules->has_mapping = true;
      const FieldDescriptor* value_des = field->message_type()->field(1);
      if (value_des->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
          value_des->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
        import_modules->has_union = true;
      }
    } else {
      if (field->is_repeated()) {
        import_modules->has_iterable = true;
      }
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        import_modules->has_union = true;
        import_modules->has_mapping = true;
      }
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
        import_modules->has_union = true;
      }
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    CheckImportModules(descriptor->nested_type(i), import_modules);
  }
}